

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

mipmapped_texture * __thiscall
crnlib::mipmapped_texture::operator=(mipmapped_texture *this,mipmapped_texture *rhs)

{
  uint uVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  vector<crnlib::mip_level_*> *this_00;
  mip_level **ppmVar3;
  mip_level *pmVar4;
  uint local_28;
  uint local_24;
  uint j;
  uint i;
  mipmapped_texture *rhs_local;
  mipmapped_texture *this_local;
  
  if (this != rhs) {
    clear(this);
    dynamic_string::operator=(&this->m_name,&rhs->m_name);
    this->m_width = rhs->m_width;
    this->m_height = rhs->m_height;
    this->m_comp_flags = rhs->m_comp_flags;
    this->m_format = rhs->m_format;
    uVar1 = vector<crnlib::vector<crnlib::mip_level_*>_>::size(&rhs->m_faces);
    vector<crnlib::vector<crnlib::mip_level_*>_>::resize(&this->m_faces,uVar1,false);
    for (local_24 = 0; uVar1 = vector<crnlib::vector<crnlib::mip_level_*>_>::size(&this->m_faces),
        local_24 < uVar1; local_24 = local_24 + 1) {
      pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_24);
      this_00 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&rhs->m_faces,local_24);
      uVar1 = vector<crnlib::mip_level_*>::size(this_00);
      vector<crnlib::mip_level_*>::resize(pvVar2,uVar1,false);
      local_28 = 0;
      while( true ) {
        pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&rhs->m_faces,local_24);
        uVar1 = vector<crnlib::mip_level_*>::size(pvVar2);
        if (uVar1 <= local_28) break;
        pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&rhs->m_faces,local_24);
        pmVar4 = (mip_level *)(ulong)local_28;
        ppmVar3 = vector<crnlib::mip_level_*>::operator[](pvVar2,local_28);
        pmVar4 = crnlib_new<crnlib::mip_level,crnlib::mip_level>((crnlib *)*ppmVar3,pmVar4);
        pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_24);
        ppmVar3 = vector<crnlib::mip_level_*>::operator[](pvVar2,local_28);
        *ppmVar3 = pmVar4;
        local_28 = local_28 + 1;
      }
    }
  }
  return this;
}

Assistant:

mipmapped_texture& mipmapped_texture::operator=(const mipmapped_texture& rhs) {
  if (this == &rhs)
    return *this;

  clear();

  m_name = rhs.m_name;
  m_width = rhs.m_width;
  m_height = rhs.m_height;

  m_comp_flags = rhs.m_comp_flags;
  m_format = rhs.m_format;

  m_faces.resize(rhs.m_faces.size());
  for (uint i = 0; i < m_faces.size(); i++) {
    m_faces[i].resize(rhs.m_faces[i].size());

    for (uint j = 0; j < rhs.m_faces[i].size(); j++)
      m_faces[i][j] = crnlib_new<mip_level>(*rhs.m_faces[i][j]);
  }

  CRNLIB_ASSERT((!is_valid()) || check());

  return *this;
}